

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * cmGlobalGenerator::EscapeJSON(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  size_type i;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar2 = 0; uVar2 < s->_M_string_length; uVar2 = uVar2 + 1) {
    cVar1 = (s->_M_dataplus)._M_p[uVar2];
    if ((cVar1 == '\\') || (cVar1 == '\"')) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::EscapeJSON(const std::string& s)
{
  std::string result;
  for (std::string::size_type i = 0; i < s.size(); ++i) {
    if (s[i] == '"' || s[i] == '\\') {
      result += '\\';
    }
    result += s[i];
  }
  return result;
}